

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::SetRange
          (CharSet<char16_t> *this,ArenaAllocator *allocator,Char lc,Char hc)

{
  CharBitvec *this_00;
  uint8 *puVar1;
  CharSetNode *pCVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  CharSetInner *this_01;
  undefined4 extraout_var;
  byte bVar9;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  uint uVar10;
  uint value;
  ulong uVar11;
  CharSetNode *pCVar12;
  uint i;
  uint uVar13;
  
  uVar10 = (uint)CONCAT62(in_register_0000000a,hc);
  uVar11 = CONCAT62(in_register_00000012,lc) & 0xffffffff;
  if ((ushort)(Char)uVar11 <= (ushort)hc) {
    if ((this->rep).compact.countPlusOne - 1 < 5) {
      if (uVar10 - (int)CONCAT62(in_register_00000012,lc) < 4) {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          uVar13 = 0;
          while( true ) {
            if (4 < (this->rep).compact.countPlusOne - 1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x1ef,"(IsCompact())","IsCompact()");
              if (!bVar5) goto LAB_00e6deff;
              *puVar8 = 0;
            }
            value = (uint)uVar11;
            if ((*(int *)&this->rep - 1U <= uVar13) ||
               ((uVar13 < 4 && value < 0x10000 &&
                (uVar6 = GetCompactCharU(this,uVar13), uVar6 == value)))) break;
            uVar13 = uVar13 + 1;
          }
          if (4 < (this->rep).compact.countPlusOne - 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x1ef,"(IsCompact())","IsCompact()");
            if (!bVar5) goto LAB_00e6deff;
            *puVar8 = 0;
          }
          if (uVar13 - *(int *)&this->rep == -1) {
            bVar5 = true;
            if (uVar13 < 4) {
              AddCompactCharU(this,value);
              goto LAB_00e6dd03;
            }
          }
          else {
LAB_00e6dd03:
            uVar11 = (ulong)(value + 1);
            bVar5 = false;
          }
        } while ((!bVar5) && ((uint)uVar11 <= uVar10));
        if (uVar10 < (uint)uVar11) {
          return;
        }
      }
      SwitchRepresentations(this,allocator);
    }
    if ((this->rep).compact.countPlusOne - 1 < 5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,1099,"(!IsCompact())","!IsCompact()");
      if (!bVar5) {
LAB_00e6deff:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    uVar13 = (uint)uVar11;
    if ((hc == L'\xffff') && (uVar13 == 0)) {
      (this->rep).full.direct.vec[4] = 0xffffffff;
      (this->rep).full.direct.vec[5] = 0xffffffff;
      (this->rep).full.direct.vec[6] = 0xffffffff;
      (this->rep).full.direct.vec[7] = 0xffffffff;
      (this->rep).compact.cs[0] = 0xffffffff;
      (this->rep).compact.cs[1] = 0xffffffff;
      (this->rep).compact.cs[2] = 0xffffffff;
      (this->rep).compact.cs[3] = 0xffffffff;
      pCVar2 = (this->rep).full.root;
      pCVar12 = (CharSetNode *)&CharSetFull::Instance;
      if (pCVar2 != (CharSetNode *)0x0) {
        (**pCVar2->_vptr_CharSetNode)(pCVar2,allocator);
      }
    }
    else {
      if (uVar13 < 0x100) {
        this_00 = &(this->rep).full.direct;
        if ((uVar10 & 0xffff) < 0x100) {
          CharBitvec::SetRange(this_00,uVar13,uVar10);
          return;
        }
        if (uVar13 == 0xff) {
          puVar1 = (this->rep).compact.padding + 0xf;
          *puVar1 = *puVar1 | 0x80;
        }
        else {
          uVar4 = uVar11 >> 5;
          bVar9 = (byte)uVar11 & 0x1f;
          if ((int)uVar4 == 7) {
            if ((uVar11 & 0x1f) == 0) {
              uVar10 = 0xffffffff;
            }
            else {
              uVar10 = ~(-1 << (-bVar9 & 0x1f)) << bVar9 | this_00->vec[uVar4];
            }
            this_00->vec[uVar4] = uVar10;
          }
          else {
            if ((uVar11 & 0x1f) == 0) {
              uVar10 = 0xffffffff;
            }
            else {
              uVar10 = ~(-1 << (-bVar9 & 0x1f)) << bVar9 | this_00->vec[uVar4];
            }
            this_00->vec[uVar4] = uVar10;
            if (uVar13 < 0xc0) {
              memset((void *)((long)this_00->vec + (ulong)(uVar13 >> 3 & 0x1c) + 4),0xff,
                     (ulong)(5 - (int)uVar4) * 4 + 4);
            }
            (this->rep).full.direct.vec[7] = 0xffffffff;
          }
        }
        uVar11 = 0x100;
      }
      if ((this->rep).compact.countPlusOne == 0) {
        this_01 = (CharSetInner *)new<Memory::ArenaAllocator>(0x88,allocator,0x366bee);
        CharSetInner::CharSetInner(this_01);
        (this->rep).full.root = (CharSetNode *)this_01;
      }
      pCVar12 = (this->rep).full.root;
      iVar7 = (*pCVar12->_vptr_CharSetNode[2])
                        (pCVar12,allocator,2,uVar11,CONCAT62(in_register_0000000a,hc) & 0xffffffff);
      pCVar12 = (CharSetNode *)CONCAT44(extraout_var,iVar7);
    }
    (this->rep).full.root = pCVar12;
  }
  return;
}

Assistant:

void CharSet<char16>::SetRange(ArenaAllocator* allocator, Char lc, Char hc)
    {
        uint l = CTU(lc);
        uint h = CTU(hc);
        if (h < l)
            return;

        if (IsCompact())
        {
            if (h - l < MaxCompact)
            {
                do
                {
                    uint i;
                    for (i = 0; i < this->GetCompactLength(); i++)
                    {
                        __assume(l <= MaxUChar);
                        if (l <= MaxUChar && i < MaxCompact)
                        {
                            if (this->GetCompactCharU(i) == l)
                                break;
                        }
                    }
                    if (i == this->GetCompactLength())
                    {
                        // Character not already in compact set
                        if (i < MaxCompact)
                        {
                            this->AddCompactCharU(l);
                        }
                        else
                            // Must switch representations
                            break;
                    }
                    l++;
                }
                while (l <= h);
                if (h < l)
                    // All chars are now in compact set
                    return;
                // else: fall-through to general case for remaining chars
            }
            // else: no use even trying

            SwitchRepresentations(allocator);
        }

        Assert(!IsCompact());

        if (l == 0 && h == MaxUChar)
        {
            rep.full.direct.SetRange(0, CharSetNode::directSize - 1);
            if (rep.full.root != nullptr)
                rep.full.root->FreeSelf(allocator);
            rep.full.root = CharSetFull::TheFullNode;
        }
        else
        {
            if (l < CharSetNode::directSize)
            {
                if (h < CharSetNode::directSize)
                {
                    rep.full.direct.SetRange(l, h);
                    return;
                }
                rep.full.direct.SetRange(l, CharSetNode::directSize - 1);
                l = CharSetNode::directSize;
            }

            if (rep.full.root == nullptr)
                rep.full.root = Anew(allocator, CharSetInner);
            rep.full.root = rep.full.root->Set(allocator, CharSetNode::levels - 1, l, h);
        }
    }